

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

int __thiscall ncnn::YoloDetectionOutput::destroy_pipeline(YoloDetectionOutput *this,Option *opt)

{
  undefined8 in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x108) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x108) + 0x28))(*(long **)(in_RDI + 0x108),in_RSI);
    if (*(long **)(in_RDI + 0x108) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x108) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x108) = 0;
  }
  return 0;
}

Assistant:

int YoloDetectionOutput::destroy_pipeline(const Option& opt)
{
    if (softmax)
    {
        softmax->destroy_pipeline(opt);
        delete softmax;
        softmax = 0;
    }

    return 0;
}